

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O2

Status __thiscall
spvtools::opt::TrimCapabilitiesPass::TrimUnrequiredCapabilities
          (TrimCapabilitiesPass *this,CapabilitySet *required_capabilities)

{
  pointer pBVar1;
  pointer pBVar2;
  bool bVar3;
  Capability capability_00;
  FeatureManager *pFVar4;
  Capability capability;
  CapabilitySet capabilities_to_trim;
  iterator __begin2;
  iterator __begin2_1;
  Capability local_94;
  CapabilitySet *local_90;
  EnumSet<spv::Capability> local_88;
  iterator local_68;
  pair<spvtools::EnumSet<spv::Capability>::Iterator,_bool> local_50;
  
  local_90 = required_capabilities;
  pFVar4 = IRContext::get_feature_mgr((this->super_Pass).context_);
  EnumSet<spv::Capability>::EnumSet(&local_88);
  EnumSet<spv::Capability>::cbegin(&local_68,&pFVar4->capabilities_);
  pBVar1 = (pFVar4->capabilities_).buckets_.
           super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pBVar2 = (pFVar4->capabilities_).buckets_.
           super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while (((local_68.set_ != &pFVar4->capabilities_ || (local_68.bucketOffset_ != 0)) ||
         (local_68.bucketIndex_ != (long)pBVar1 - (long)pBVar2 >> 4))) {
    local_94 = EnumSet<spv::Capability>::Iterator::operator*(&local_68);
    bVar3 = EnumSet<spv::Capability>::contains(&this->untouchableCapabilities_,local_94);
    if (!bVar3) {
      bVar3 = EnumSet<spv::Capability>::contains(&this->supportedCapabilities_,local_94);
      if (bVar3) {
        bVar3 = EnumSet<spv::Capability>::contains(local_90,local_94);
        if (!bVar3) {
          EnumSet<spv::Capability>::insert(&local_50,&local_88,&local_94);
        }
      }
    }
    EnumSet<spv::Capability>::Iterator::operator++(&local_68);
  }
  EnumSet<spv::Capability>::cbegin(&local_50.first,&local_88);
  while (((local_50.first.set_ != &local_88 || (local_50.first.bucketOffset_ != 0)) ||
         (local_50.first.bucketIndex_ !=
          (long)local_88.buckets_.
                super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_88.buckets_.
                super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4))) {
    capability_00 = EnumSet<spv::Capability>::Iterator::operator*(&local_50.first);
    IRContext::RemoveCapability((this->super_Pass).context_,capability_00);
    EnumSet<spv::Capability>::Iterator::operator++(&local_50.first);
  }
  std::
  _Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
  ::~_Vector_base((_Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                   *)&local_88);
  return (local_88.size_ == 0) + SuccessWithChange;
}

Assistant:

Pass::Status TrimCapabilitiesPass::TrimUnrequiredCapabilities(
    const CapabilitySet& required_capabilities) const {
  const FeatureManager* feature_manager = context()->get_feature_mgr();
  CapabilitySet capabilities_to_trim;
  for (auto capability : feature_manager->GetCapabilities()) {
    // Some capabilities cannot be safely removed. Leaving them untouched.
    if (untouchableCapabilities_.contains(capability)) {
      continue;
    }

    // If the capability is unsupported, don't trim it.
    if (!supportedCapabilities_.contains(capability)) {
      continue;
    }

    if (required_capabilities.contains(capability)) {
      continue;
    }

    capabilities_to_trim.insert(capability);
  }

  for (auto capability : capabilities_to_trim) {
    context()->RemoveCapability(capability);
  }

  return capabilities_to_trim.size() == 0 ? Pass::Status::SuccessWithoutChange
                                          : Pass::Status::SuccessWithChange;
}